

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O0

void __thiscall
modified_signaturecase::_impl<picnic_params_t>
          (modified_signaturecase *this,anon_enum_32 *parameters)

{
  bool bVar1;
  int iVar2;
  result_type rVar3;
  result_type rVar4;
  result_type rVar5;
  value_expr<int> *this_00;
  uchar *puVar6;
  uchar *puVar7;
  size_type sVar8;
  const_string *msg;
  reference pvVar9;
  undefined4 *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature2;
  size_t rounds;
  size_t l;
  default_random_engine eng;
  random_device rnd;
  uniform_int_distribution<unsigned_int> dist_pos;
  uniform_int_distribution<unsigned_int> dist_diff;
  size_t signature_len;
  size_t message_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> message;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  picnic_privatekey_t sk;
  picnic_publickey_t pk;
  size_t max_signature_size;
  context_frame context_frame_1590;
  lazy_ostream *in_stack_ffffffffffffe758;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__urng;
  undefined4 in_stack_ffffffffffffe760;
  result_type in_stack_ffffffffffffe764;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>
  *in_stack_ffffffffffffe768;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffe770;
  size_type in_stack_ffffffffffffe778;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffe780;
  const_string *in_stack_ffffffffffffe798;
  undefined4 in_stack_ffffffffffffe7a0;
  undefined4 in_stack_ffffffffffffe7a4;
  undefined4 in_stack_ffffffffffffe7a8;
  undefined4 in_stack_ffffffffffffe7ac;
  lazy_ostream *in_stack_ffffffffffffe7b0;
  lazy_ostream *in_stack_ffffffffffffe7e0;
  undefined1 no_message;
  value_expr<const_unsigned_long_&> *in_stack_ffffffffffffe7e8;
  basic_cstring<const_char> local_17b8;
  basic_cstring<const_char> local_17a8;
  lazy_ostream local_1798 [2];
  undefined4 local_1774;
  assertion_result local_1768;
  long local_1718;
  const_string *pcVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb30;
  basic_cstring<const_char> local_368;
  basic_cstring<const_char> local_358;
  lazy_ostream local_348 [2];
  undefined1 local_323;
  assertion_result local_320;
  basic_cstring<const_char> local_2f8;
  basic_cstring<const_char> local_2e8;
  basic_cstring<const_char> local_2d8;
  lazy_ostream local_2c8 [2];
  undefined1 local_2a3;
  assertion_result local_2a0;
  basic_cstring<const_char> local_278;
  undefined8 local_268;
  undefined8 local_260;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_240;
  basic_cstring<const_char> local_228;
  basic_cstring<const_char> local_218;
  lazy_ostream local_208 [2];
  undefined1 local_1e3;
  assertion_result local_1e0;
  basic_cstring<const_char> local_1b8;
  undefined1 local_1a2 [97];
  undefined1 local_141 [65];
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  lazy_ostream local_e0 [3];
  assertion_result local_b0;
  basic_cstring<const_char> local_88;
  undefined8 local_78;
  undefined8 local_60;
  context_frame local_14;
  undefined4 *local_10;
  
  local_10 = in_RSI;
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            (&in_stack_ffffffffffffe768->super_lazy_ostream,
             (char (*) [16])CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
  local_60 = picnic_get_param_name(*local_10);
  boost::unit_test::operator<<
            (in_stack_ffffffffffffe768,
             (char **)CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
  boost::test_tools::tt_detail::context_frame::context_frame
            ((context_frame *)CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760),
             in_stack_ffffffffffffe758);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>,_const_char_*,_const_char_*const_&>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>,_const_char_*,_const_char_*const_&>
              *)0x1cfbff);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]> *)
             0x1cfc0c);
  bVar1 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(&local_14);
  if (bVar1) {
    local_78 = picnic_signature_size(*local_10);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe7b0,
                 (const_string *)CONCAT44(in_stack_ffffffffffffe7ac,in_stack_ffffffffffffe7a8),
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)in_stack_ffffffffffffe768,
                 (unsigned_long *)CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
      boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
                (in_stack_ffffffffffffe7e8,SUB81((ulong)in_stack_ffffffffffffe7e0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_f0,"max_signature_size",0x12);
      boost::unit_test::operator<<
                (&in_stack_ffffffffffffe768->super_lazy_ostream,
                 (basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_100,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_b0,local_e0,&local_100,0xa1,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1cfd9b);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1cfda8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe7b0,
                 (const_string *)CONCAT44(in_stack_ffffffffffffe7ac,in_stack_ffffffffffffe7a8),
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798);
      iVar2 = picnic_keygen(*local_10,local_141,local_1a2);
      local_1e3 = iVar2 == 0;
      boost::test_tools::assertion::seed::operator->*
                ((seed *)in_stack_ffffffffffffe768,
                 (bool *)CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
      boost::test_tools::assertion::value_expr<bool>::evaluate
                ((value_expr<bool> *)in_stack_ffffffffffffe7e8,
                 SUB81((ulong)in_stack_ffffffffffffe7e0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_218,"!picnic_keygen(parameters, &pk, &sk)",0x24);
      boost::unit_test::operator<<
                (&in_stack_ffffffffffffe768->super_lazy_ostream,
                 (basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_228,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_1e0,local_208,&local_228,0xa5,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1cff30);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1cff3d);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cff5f);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cff6c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
    local_260 = 0x200;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
    (anonymous_namespace)::
    randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_fffffffffffffb30);
    local_268 = local_78;
    do {
      no_message = (undefined1)((ulong)in_stack_ffffffffffffe7e0 >> 0x38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_278,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe7b0,
                 (const_string *)CONCAT44(in_stack_ffffffffffffe7ac,in_stack_ffffffffffffe7a8),
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798);
      this_00 = (value_expr<int> *)
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d002c);
      puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d0041);
      iVar2 = picnic_sign(local_1a2,this_00,0x200,puVar6,&local_268);
      local_2a3 = iVar2 == 0;
      boost::test_tools::assertion::seed::operator->*
                ((seed *)in_stack_ffffffffffffe768,
                 (bool *)CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
      boost::test_tools::assertion::value_expr<bool>::evaluate
                ((value_expr<bool> *)this_00,(bool)no_message);
      in_stack_ffffffffffffe7e0 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2d8,
                 "!picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len)"
                 ,0x51);
      boost::unit_test::operator<<
                (&in_stack_ffffffffffffe768->super_lazy_ostream,
                 (basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_2a0,local_2c8,&local_2e8,0xb0,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1d0163);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1d0170);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffe7b0,
                 (const_string *)CONCAT44(in_stack_ffffffffffffe7ac,in_stack_ffffffffffffe7a8),
                 CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0),
                 in_stack_ffffffffffffe798);
      puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d0200);
      puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d0217);
      sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_240);
      iVar2 = picnic_verify(local_141,puVar6,0x200,puVar7,sVar8);
      local_323 = iVar2 == 0;
      boost::test_tools::assertion::seed::operator->*
                ((seed *)in_stack_ffffffffffffe768,
                 (bool *)CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
      boost::test_tools::assertion::value_expr<bool>::evaluate
                ((value_expr<bool> *)this_00,SUB81((ulong)in_stack_ffffffffffffe7e0 >> 0x38,0));
      in_stack_ffffffffffffe7b0 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_358,
                 "!picnic_verify(&pk, message.data(), message_size, signature.data(), signature.size())"
                 ,0x55);
      boost::unit_test::operator<<
                (&in_stack_ffffffffffffe768->super_lazy_ostream,
                 (basic_cstring<const_char> *)
                 CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_368,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      __urng = (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_320,local_348,&local_368,0xb3,CHECK,CHECK_BUILT_ASSERTION);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1d0336);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1d0343);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
              ((uniform_int_distribution<unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760),
               (uint)((ulong)__urng >> 0x20),(uint)__urng);
    std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
              ((uniform_int_distribution<unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760),
               (uint)((ulong)__urng >> 0x20),(uint)__urng);
    std::random_device::random_device
              ((random_device *)CONCAT44(in_stack_ffffffffffffe7a4,in_stack_ffffffffffffe7a0));
    rVar3 = std::random_device::operator()((random_device *)0x1d039e);
    std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
    linear_congruential_engine
              ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760),
               (result_type_conflict)__urng);
    rVar4 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760),__urng);
    msg = (const_string *)(ulong)rVar4;
    for (local_1718 = 0x20; local_1718 != 0; local_1718 = local_1718 + -1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffe7b0,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(rVar3,rVar4));
      rVar5 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)
                         CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760),__urng);
      pcVar10 = msg;
      sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &stack0xffffffffffffe8d0);
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &stack0xffffffffffffe8d0,(ulong)msg % sVar8);
      *pvVar9 = *pvVar9 + (char)rVar5;
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)&stack0xffffffffffffe8c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                   ,0x5e);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffe7b0,
                   (const_string *)CONCAT44(rVar3,rVar4),CONCAT44(rVar5,in_stack_ffffffffffffe7a0),
                   msg);
        puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d04d7);
        in_stack_ffffffffffffe770 =
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffe8d0;
        puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d04ee);
        sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          (in_stack_ffffffffffffe770);
        local_1774 = picnic_verify(local_141,puVar6,0x200,puVar7,sVar8);
        boost::test_tools::assertion::seed::operator->*
                  ((seed *)in_stack_ffffffffffffe768,
                   (int *)CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
        boost::test_tools::assertion::value_expr<int>::evaluate
                  (this_00,SUB81((ulong)in_stack_ffffffffffffe7e0 >> 0x38,0));
        in_stack_ffffffffffffe768 =
             (lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]> *)
             boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_17a8,
                   "picnic_verify(&pk, message.data(), message_size, signature2.data(), signature2.size())"
                   ,0x56);
        boost::unit_test::operator<<
                  (&in_stack_ffffffffffffe768->super_lazy_ostream,
                   (basic_cstring<const_char> *)
                   CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760));
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_17b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                   ,0x5e);
        __urng = (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_1768,local_1798,&local_17b8,0xc0,CHECK,CHECK_BUILT_ASSERTION);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)0x1d060a);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1d0617);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffe770)
      ;
      in_stack_ffffffffffffe764 =
           std::uniform_int_distribution<unsigned_int>::operator()
                     ((uniform_int_distribution<unsigned_int> *)
                      CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760),__urng);
      msg = (const_string *)((long)&pcVar10->m_begin + (ulong)in_stack_ffffffffffffe764);
    }
    std::random_device::~random_device((random_device *)0x1d08a9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffe770);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffe770);
  }
  boost::test_tools::tt_detail::context_frame::~context_frame((context_frame *)0x1d08fb);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(modified_signature, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature, message;
    signature.resize(max_signature_size);

    const size_t message_size = message_inc;
    message.resize(message_size);
    // fill message with some data
    randomize_container(message);

    size_t signature_len = max_signature_size;
    BOOST_TEST(!picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len));
    signature.resize(signature_len);
    BOOST_TEST(
        !picnic_verify(&pk, message.data(), message_size, signature.data(), signature.size()));

    std::uniform_int_distribution<unsigned int> dist_diff{1, 255};
    std::uniform_int_distribution<unsigned int> dist_pos{1, PICNIC_MAX_SIGNATURE_SIZE};
    std::random_device rnd;
    std::default_random_engine eng{rnd()};

    for (size_t l = dist_pos(eng), rounds = rep; rounds; l += dist_pos(eng), --rounds) {
      std::vector<uint8_t> signature2{signature};
      signature2[l % signature2.size()] += dist_diff(eng);

      // must fail
      BOOST_TEST(
          picnic_verify(&pk, message.data(), message_size, signature2.data(), signature2.size()));
    }
  }
}